

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

int lj_opt_fwd_sbuf(jit_State *J,IRRef lim)

{
  ushort uVar1;
  IRIns *pIVar2;
  IRIns *ir_1;
  IRIns *ir;
  IRRef ref;
  IRRef lim_local;
  jit_State *J_local;
  
  if (lim < J->chain[0x56]) {
    J_local._4_4_ = 0;
  }
  else {
    uVar1 = J->chain[0x62];
    while (ir._0_4_ = (uint)uVar1, lim < (uint)ir) {
      pIVar2 = (J->cur).ir;
      if ((6 < (&pIVar2->field_0)[(uint)ir].op2) && ((&pIVar2->field_0)[(uint)ir].op2 < 0x1e)) {
        return 0;
      }
      uVar1 = (&pIVar2->field_0)[(uint)ir].prev;
    }
    uVar1 = J->chain[0x61];
    while (ir._0_4_ = (uint)uVar1, lim < (uint)ir) {
      pIVar2 = (J->cur).ir;
      if ((6 < (&pIVar2->field_0)[(uint)ir].op2) && ((&pIVar2->field_0)[(uint)ir].op2 < 0x1e)) {
        return 0;
      }
      uVar1 = (&pIVar2->field_0)[(uint)ir].prev;
    }
    J_local._4_4_ = 1;
  }
  return J_local._4_4_;
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_sbuf(jit_State *J, IRRef lim)
{
  IRRef ref;
  if (J->chain[IR_BUFPUT] > lim)
    return 0;  /* Conflict. */
  ref = J->chain[IR_CALLS];
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op2 >= IRCALL_lj_strfmt_putint && ir->op2 < IRCALL_lj_buf_tostr)
      return 0;  /* Conflict. */
    ref = ir->prev;
  }
  ref = J->chain[IR_CALLL];
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op2 >= IRCALL_lj_strfmt_putint && ir->op2 < IRCALL_lj_buf_tostr)
      return 0;  /* Conflict. */
    ref = ir->prev;
  }
  return 1;  /* No conflict. Can safely FOLD/CSE. */
}